

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_mycanvas.c
# Opt level: O0

void my_canvas_dialog(t_my_canvas *x,t_symbol *s,int argc,t_atom *argv)

{
  _glist *canvas;
  t_symbol *s_00;
  t_float tVar1;
  undefined1 local_178 [8];
  t_atom undo [18];
  int sr_flags;
  int h;
  int w;
  int a;
  t_symbol *srl [3];
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  t_my_canvas *x_local;
  
  tVar1 = atom_getfloatarg(0,argc,argv);
  h = (int)tVar1;
  tVar1 = atom_getfloatarg(2,argc,argv);
  sr_flags = (int)tVar1;
  tVar1 = atom_getfloatarg(3,argc,argv);
  undo[0x11].a_w._4_4_ = (undefined4)tVar1;
  iemgui_setdialogatoms(&x->x_gui,0x12,(t_atom *)local_178);
  undo[0].a_w.w_float = 1.4013e-45;
  undo[1].a_type = A_NULL;
  undo[1].a_w.w_float = 1.4013e-45;
  undo[2].a_type = (t_atomtype)(float)x->x_vis_w;
  undo[2].a_w.w_float = 1.4013e-45;
  undo[3].a_type = (t_atomtype)(float)x->x_vis_h;
  undo[4].a_w.w_float = 1.4013e-45;
  undo[5].a_type = 0xbf800000;
  undo[0xe].a_w.w_float = 2.8026e-45;
  undo[0xf]._0_8_ = gensym("none");
  canvas = (x->x_gui).x_glist;
  s_00 = gensym("dialog");
  pd_undo_set_objectstate(canvas,(t_pd *)x,s_00,0x12,(t_atom *)local_178,argc,argv);
  undo[0x11].a_w._0_4_ = iemgui_dialog(&x->x_gui,(t_symbol **)&w,argc,argv);
  (x->x_gui).x_isa = (t_iem_init_symargs)((uint)(x->x_gui).x_isa & 0xfffffffe);
  if (h < 1) {
    h = 1;
  }
  (x->x_gui).x_w = h * ((x->x_gui).x_glist)->gl_zoom;
  (x->x_gui).x_h = (x->x_gui).x_w;
  if (sr_flags < 1) {
    sr_flags = 1;
  }
  x->x_vis_w = sr_flags;
  if ((int)undo[0x11].a_w._4_4_ < 1) {
    undo[0x11].a_w._4_4_ = 1;
  }
  x->x_vis_h = undo[0x11].a_w._4_4_;
  iemgui_size(x,&x->x_gui);
  return;
}

Assistant:

static void my_canvas_dialog(t_my_canvas *x, t_symbol *s, int argc, t_atom *argv)
{
    t_symbol *srl[3];
    int a = atom_getfloatarg(0, argc, argv);
    int w = atom_getfloatarg(2, argc, argv);
    int h = atom_getfloatarg(3, argc, argv);
    int sr_flags;
    t_atom undo[18];
    iemgui_setdialogatoms(&x->x_gui, 18, undo);
    SETFLOAT (undo+1, 0);
    SETFLOAT (undo+2, x->x_vis_w);
    SETFLOAT (undo+3, x->x_vis_h);
    SETFLOAT (undo+5, -1);
    SETSYMBOL(undo+15, gensym("none"));

    pd_undo_set_objectstate(x->x_gui.x_glist, (t_pd*)x, gensym("dialog"),
                            18, undo,
                            argc, argv);

    sr_flags = iemgui_dialog(&x->x_gui, srl, argc, argv);
    x->x_gui.x_isa.x_loadinit = 0;
    if(a < 1)
        a = 1;
    x->x_gui.x_w = a * IEMGUI_ZOOM(x);
    x->x_gui.x_h = x->x_gui.x_w;
    if(w < 1)
        w = 1;
    x->x_vis_w = w;
    if(h < 1)
        h = 1;
    x->x_vis_h = h;
    iemgui_size((void *)x, &x->x_gui);
}